

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O0

int parseConv(mpt_convertable *val,mpt_type_t type,void *dest)

{
  iovec *vec;
  mpt_parseIterator *it;
  void *dest_local;
  mpt_type_t type_local;
  mpt_convertable *val_local;
  
  if (type == 0) {
    if (dest == (void *)0x0) {
      val_local._4_4_ = 0x86;
    }
    else {
      *(uint8_t **)dest = parseConv::fmt;
      val_local._4_4_ = 0;
    }
  }
  else if (type == 0x73) {
    *(mpt_convertable **)dest = val + 10;
    val_local._4_4_ = 0x73;
  }
  else if ((type == 0x40) || (type == 0x43)) {
    if (dest != (void *)0x0) {
      *(mpt_convertable **)dest = val + 10;
      if (val[8]._vptr == (_mpt_vptr_convertable *)0x0) {
        *(long *)((long)dest + 8) = (long)val[7]._vptr - (long)val[6]._vptr;
      }
      else {
        *(long *)((long)dest + 8) = (long)val[8]._vptr - (long)val[6]._vptr;
      }
    }
    val_local._4_4_ = 0x73;
  }
  else if (type == 0x86) {
    if (dest != (void *)0x0) {
      *(mpt_convertable **)dest = val + 1;
    }
    val_local._4_4_ = 0x73;
  }
  else {
    val_local._4_4_ = -3;
  }
  return val_local._4_4_;
}

Assistant:

static int parseConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *dest)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, val, _mt);
	
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeIteratorPtr), 's', 0 };
		if (dest) {
			*((const uint8_t **) dest) = fmt;
			return 0;
		}
		return MPT_ENUM(TypeIteratorPtr);
	}
	if (type == 's') {
		*((const char **) dest) = (char *) (it + 1);
		return 's';
	}
	if (type == MPT_ENUM(TypeVector)
	    || type == MPT_type_toVector('c')) {
		struct iovec *vec;
		if ((vec = dest)) {
			vec->iov_base = it + 1;
			if (it->restore) {
				vec->iov_len = it->restore - it->val;
			} else {
				vec->iov_len = it->end - it->val;
			}
		}
		return 's';
	}
	if (type == MPT_ENUM(TypeIteratorPtr)) {
		if (dest) *((void **) dest) = &it->_it;
		return 's';
	}
	return MPT_ERROR(BadType);
}